

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core_read.cpp
# Opt level: O3

bool DecodeHexTx(CMutableTransaction *tx,string *hex_tx,bool try_no_witness,bool try_witness)

{
  CMutableTransaction *pCVar1;
  uint32_t uVar2;
  bool bVar3;
  bool bVar4;
  size_type sVar5;
  size_type sVar6;
  long in_FS_OFFSET;
  string_view str;
  string_view hex_str;
  Span<const_std::byte> sp;
  Span<const_std::byte> sp_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> txData;
  DataStream ssData;
  CMutableTransaction tx_legacy;
  CMutableTransaction tx_extended;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_110;
  DataStream local_f8;
  CMutableTransaction local_d8;
  CMutableTransaction local_98;
  ParamsStream<DataStream_&,_TransactionSerParams> local_58;
  ParamsStream<DataStream_&,_TransactionSerParams> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  str._M_str = (hex_tx->_M_dataplus)._M_p;
  str._M_len = hex_tx->_M_string_length;
  bVar3 = IsHex(str);
  if (!bVar3) {
    bVar3 = false;
    goto LAB_0069f3ab;
  }
  hex_str._M_str = (hex_tx->_M_dataplus)._M_p;
  hex_str._M_len = hex_tx->_M_string_length;
  ParseHex<unsigned_char>(&local_110,hex_str);
  CMutableTransaction::CMutableTransaction(&local_98);
  CMutableTransaction::CMutableTransaction(&local_d8);
  if (try_witness) {
    sp.m_size = (long)local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    sp.m_data = local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
    DataStream::DataStream(&local_f8,sp);
    local_58.m_params = &TX_WITH_WITNESS;
    local_58.m_substream = &local_f8;
    UnserializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CMutableTransaction>
              (&local_98,&local_58,&TX_WITH_WITNESS);
    sVar6 = local_f8.m_read_pos;
    sVar5 = (long)local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_f8);
    if (sVar5 != sVar6) goto LAB_0069f194;
    bVar4 = CheckTxScriptsSanity(&local_98);
    bVar3 = true;
    if (!bVar4) goto LAB_0069f197;
LAB_0069f2cb:
    local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_start;
    (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_98.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
              ((vector<CTxIn,_std::allocator<CTxIn>_> *)&local_f8);
    local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage;
    (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start;
    local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_start = local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start;
    (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
              ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_f8);
    pCVar1 = &local_98;
LAB_0069f359:
    uVar2 = pCVar1->nLockTime;
    tx->version = pCVar1->version;
    tx->nLockTime = uVar2;
    bVar3 = true;
  }
  else {
LAB_0069f194:
    bVar3 = false;
LAB_0069f197:
    if (try_no_witness) {
      sp_00.m_size = (long)local_110.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_110.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start;
      sp_00.m_data = local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start;
      DataStream::DataStream(&local_f8,sp_00);
      local_48.m_params = &TX_NO_WITNESS;
      local_48.m_substream = &local_f8;
      UnserializeTransaction<ParamsStream<DataStream&,TransactionSerParams>,CMutableTransaction>
                (&local_d8,&local_48,&TX_NO_WITNESS);
      sVar6 = (long)local_f8.vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_f8.vch.
                    super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
                    super__Vector_impl_data._M_start;
      std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
                ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_f8);
      if (sVar6 != local_f8.m_read_pos) goto LAB_0069f2c2;
      bVar4 = CheckTxScriptsSanity(&local_d8);
      pCVar1 = &local_d8;
      if ((!bVar4) && (bVar3)) goto LAB_0069f2cb;
      local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = local_d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      local_d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
      ._M_start = (pointer)0x0;
      local_d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
      ._M_finish = (pointer)0x0;
      local_d8.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage = (pointer)0x0;
      std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector
                ((vector<CTxIn,_std::allocator<CTxIn>_> *)&local_f8);
      local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_end_of_storage =
           local_d8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_start;
      local_f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)(tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_start = local_d8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                  super__Vector_impl_data._M_start;
      (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
      ._M_finish = local_d8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_finish;
      local_d8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_d8.vout.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                ((vector<CTxOut,_std::allocator<CTxOut>_> *)&local_f8);
      goto LAB_0069f359;
    }
LAB_0069f2c2:
    if (bVar3) goto LAB_0069f2cb;
    bVar3 = false;
  }
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_d8.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_d8.vin);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&local_98.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&local_98.vin);
  if (local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (byte *)0x0) {
    operator_delete(local_110.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_110.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
LAB_0069f3ab:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool DecodeHexTx(CMutableTransaction& tx, const std::string& hex_tx, bool try_no_witness, bool try_witness)
{
    if (!IsHex(hex_tx)) {
        return false;
    }

    std::vector<unsigned char> txData(ParseHex(hex_tx));
    return DecodeTx(tx, txData, try_no_witness, try_witness);
}